

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O2

void __thiscall
cfd::core::Serializer::AddPrefixBuffer(Serializer *this,uint64_t prefix,ByteData *buffer)

{
  CfdException *this_00;
  allocator local_59;
  undefined1 local_58 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&buf,&buffer->data_);
  if ((ulong)((long)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start) >> 0x20 == 0) {
    AddPrefixBuffer(this,prefix,
                    buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (uint32_t)
                    ((long)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start));
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return;
  }
  local_58._0_8_ = "cfdcore_bytedata.cpp";
  local_58._8_4_ = 0x18d;
  local_58._16_8_ = "AddPrefixBuffer";
  logger::warn<>((CfdSourceLocation *)local_58,"It exceeds the handling size.");
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)local_58,"It exceeds the handling size.",&local_59);
  CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)local_58);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void Serializer::AddPrefixBuffer(uint64_t prefix, const ByteData& buffer) {
  auto buf = buffer.GetBytes();
  if (buf.size() > std::numeric_limits<uint32_t>::max()) {
    warn(CFD_LOG_SOURCE, "It exceeds the handling size.");
    throw CfdException(kCfdIllegalStateError, "It exceeds the handling size.");
  }
  AddPrefixBuffer(prefix, buf.data(), static_cast<uint32_t>(buf.size()));
}